

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,ArrayPtr<const_char> *params_4,StringTree *params_5,
          ArrayPtr<const_char> *params_6,ArrayPtr<const_char> *params_7,
          ArrayPtr<const_char> *params_8,ArrayPtr<const_char> *params_9,
          ArrayPtr<const_char> *params_10)

{
  Branch *pBVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  char *__n;
  size_t __n_00;
  Branch *pBVar4;
  long lVar5;
  size_t result_2;
  char *pos;
  size_t result;
  size_t sVar6;
  char *local_c8;
  size_t sStack_c0;
  size_t local_b8;
  size_t sStack_b0;
  size_t local_a8;
  char *local_a0;
  char *local_98;
  size_t sStack_90;
  size_t local_88;
  size_t sStack_80;
  size_t local_78;
  String local_68;
  ArrayPtr<const_char> *local_50;
  ArrayPtr<const_char> *local_48;
  ArrayPtr<const_char> *local_40;
  ArrayPtr<const_char> *local_38;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_c8 = (this->text).content.ptr;
  sStack_c0 = params->size_;
  local_b8 = params_1->size_;
  sStack_b0 = params_2->size_;
  local_a8 = params_3->size_;
  local_a0 = params_4->ptr;
  local_98 = (params_5->text).content.ptr;
  sStack_90 = params_6->size_;
  local_88 = params_7->size_;
  sStack_80 = params_8->size_;
  local_78 = params_9->size_;
  sVar6 = 0;
  lVar5 = 0;
  do {
    sVar6 = sVar6 + *(long *)((long)&local_c8 + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x58);
  __return_storage_ptr__->size_ = sVar6;
  local_a0 = (char *)0x0;
  sVar6 = 0;
  lVar5 = 0;
  do {
    sVar6 = sVar6 + *(long *)((long)&local_c8 + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x58);
  local_50 = params;
  local_48 = params_1;
  local_40 = params_2;
  local_38 = params_3;
  heapString(&local_68,sVar6);
  (__return_storage_ptr__->text).content.ptr = local_68.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_68.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_68.content.disposer;
  sVar6 = 0;
  local_a8 = 0;
  local_b8 = 0;
  sStack_b0 = 0;
  local_c8 = (char *)0x0;
  sStack_c0 = 0;
  local_a0 = (char *)0x1;
  local_98 = (char *)0x0;
  sStack_90 = 0;
  local_88 = 0;
  sStack_80 = 0;
  local_78 = 0;
  lVar5 = 0;
  do {
    sVar6 = sVar6 + *(long *)((long)&local_c8 + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x58);
  pBVar4 = (Branch *)
           _::HeapArrayDisposer::allocateImpl
                     (0x40,sVar6,sVar6,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      construct,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      destruct);
  local_68.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar1 = (__return_storage_ptr__->branches).ptr;
  local_68.content.ptr = (char *)pBVar4;
  local_68.content.size_ = sVar6;
  if (pBVar1 != (Branch *)0x0) {
    sVar2 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar3 = (__return_storage_ptr__->branches).disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pBVar1,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = pBVar4;
  (__return_storage_ptr__->branches).size_ = sVar6;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  __n = (this->text).content.ptr;
  if (__n != (char *)0x0) {
    memcpy(pos,(void *)this->size_,(size_t)__n);
    pos = pos + (long)__n;
  }
  __n_00 = local_50->size_;
  if (__n_00 != 0) {
    memcpy(pos,local_50->ptr,__n_00);
    pos = pos + __n_00;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,local_48,local_40,local_38,(StringTree *)params_4,
             (ArrayPtr<const_char> *)params_5,params_6,params_7,params_8,params_9);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}